

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_rb_acquire_write(ma_rb *pRB,size_t *pSizeInBytes,void **ppBufferOut)

{
  uint uVar1;
  long *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  size_t bytesRequested;
  size_t bytesAvailable;
  ma_uint32 writeOffsetLoopFlag;
  ma_uint32 writeOffsetInBytes;
  ma_uint32 writeOffset;
  ma_uint32 readOffsetLoopFlag;
  ma_uint32 readOffsetInBytes;
  ma_uint32 readOffset;
  ulong local_a8;
  ulong local_a0;
  undefined1 local_98 [4];
  undefined1 local_94 [4];
  uint local_90;
  undefined1 local_8c [4];
  undefined1 local_88 [4];
  uint local_84;
  ma_result local_64;
  size_t local_60;
  void *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  uint local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  uint local_28;
  uint local_24;
  uint local_14;
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  if (((in_RDI == (long *)0x0) || (in_RSI == (ulong *)0x0)) || (in_RDX == (long *)0x0)) {
    local_64 = MA_INVALID_ARGS;
  }
  else {
    local_84 = *(uint *)((long)in_RDI + 0x14);
    local_30 = local_88;
    local_38 = local_8c;
    local_90 = *(uint *)(in_RDI + 3);
    local_48 = local_94;
    local_50 = local_98;
    if ((local_90 & 0x80000000) == (local_84 & 0x80000000)) {
      uVar1 = (int)in_RDI[1] - (local_90 & 0x7fffffff);
    }
    else {
      uVar1 = (local_84 & 0x7fffffff) - (local_90 & 0x7fffffff);
    }
    local_a0 = (ulong)uVar1;
    local_a8 = *in_RSI;
    if (local_a0 < local_a8) {
      local_a8 = local_a0;
    }
    *in_RSI = local_a8;
    local_24 = *(uint *)(in_RDI + 3);
    *in_RDX = *in_RDI + (ulong)(local_24 & 0x7fffffff);
    if (*(char *)((long)in_RDI + 0x1d) != '\0') {
      local_58 = (void *)*in_RDX;
      local_60 = *in_RSI;
      if ((local_58 != (void *)0x0) && (local_60 != 0)) {
        local_3c = local_90;
        local_28 = local_84;
        local_14 = local_24;
        local_10 = local_84;
        local_c = local_90;
        local_8 = local_84;
        local_4 = local_90;
        memset(local_58,0,local_60);
      }
    }
    local_64 = MA_SUCCESS;
  }
  return local_64;
}

Assistant:

MA_API ma_result ma_rb_acquire_write(ma_rb* pRB, size_t* pSizeInBytes, void** ppBufferOut)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    size_t bytesAvailable;
    size_t bytesRequested;

    if (pRB == NULL || pSizeInBytes == NULL || ppBufferOut == NULL) {
        return MA_INVALID_ARGS;
    }

    /* The returned buffer should never overtake the read buffer. */
    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = ma_atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    /*
    In the case of writing, if the write pointer and the read pointer are on the same loop iteration we can only
    write up to the end of the buffer. Otherwise we can only write up to the read pointer. The write pointer should
    never overtake the read pointer.
    */
    if (writeOffsetLoopFlag == readOffsetLoopFlag) {
        bytesAvailable = pRB->subbufferSizeInBytes - writeOffsetInBytes;
    } else {
        bytesAvailable = readOffsetInBytes - writeOffsetInBytes;
    }

    bytesRequested = *pSizeInBytes;
    if (bytesRequested > bytesAvailable) {
        bytesRequested = bytesAvailable;
    }

    *pSizeInBytes = bytesRequested;
    *ppBufferOut  = ma_rb__get_write_ptr(pRB);

    /* Clear the buffer if desired. */
    if (pRB->clearOnWriteAcquire) {
        MA_ZERO_MEMORY(*ppBufferOut, *pSizeInBytes);
    }

    return MA_SUCCESS;
}